

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[22],kj::CappedArray<char,17ul>&,char_const(&)[4]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [22],
          CappedArray<char,_17UL> *params_1,char (*params_2) [4])

{
  char (*value) [22];
  CappedArray<char,_17UL> *value_00;
  char (*value_01) [4];
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  CappedArray<char,_17UL> *local_28;
  char (*params_local_2) [4];
  CappedArray<char,_17UL> *params_local_1;
  char (*params_local) [22];
  
  local_28 = params_1;
  params_local_2 = (char (*) [4])params;
  params_local_1 = (CappedArray<char,_17UL> *)this;
  params_local = (char (*) [22])__return_storage_ptr__;
  value = ::const((char (*) [22])this);
  local_38 = _::toStringTreeOrCharSequence<char_const(&)[22]>(value);
  value_00 = fwd<kj::CappedArray<char,17ul>&>((CappedArray<char,_17UL> *)params_local_2);
  local_48 = _::toStringTreeOrCharSequence<kj::CappedArray<char,17ul>&>(value_00);
  value_01 = ::const((char (*) [4])local_28);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[4]>(value_01);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}